

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O1

void __thiscall
wasm::OptimizationOptions::addPassArg(OptimizationOptions *this,string *key,string *value)

{
  pointer pPVar1;
  pointer pPVar2;
  size_t sVar3;
  size_t __n;
  string *__k;
  char cVar4;
  int iVar5;
  string *psVar6;
  mapped_type *pmVar7;
  pointer pPVar8;
  bool bVar9;
  undefined1 local_1d8 [392];
  pointer local_50;
  OptimizationOptions *local_48;
  string *local_40;
  string *local_38;
  
  pPVar2 = (this->passes).
           super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar8 = (this->passes).
           super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = pPVar8 == pPVar2;
  local_48 = this;
  local_40 = value;
  local_38 = key;
  if (!bVar9) {
    local_50 = (key->_M_dataplus)._M_p;
    sVar3 = key->_M_string_length;
    do {
      pPVar1 = pPVar8 + -1;
      __n = pPVar8[-1].name._M_string_length;
      if ((__n == sVar3) &&
         ((__n == 0 || (iVar5 = bcmp((pPVar1->name)._M_dataplus._M_p,local_50,__n), iVar5 == 0)))) {
        if (pPVar8[-1].argument.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          Fatal::Fatal((Fatal *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1d8 + 0x10),pPVar8[-1].name._M_dataplus._M_p,
                     pPVar8[-1].name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1d8 + 0x10)," already set to ",0x10);
          Fatal::operator<<((Fatal *)local_1d8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pPVar8[-1].argument);
          goto LAB_001acb59;
        }
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&pPVar8[-1].argument,local_40);
        if (!bVar9) {
          return;
        }
        break;
      }
      bVar9 = pPVar1 == pPVar2;
      pPVar8 = pPVar1;
    } while (!bVar9);
  }
  psVar6 = (string *)::wasm::PassRegistry::get();
  __k = local_38;
  cVar4 = ::wasm::PassRegistry::containsPass(psVar6);
  if (cVar4 == '\0') {
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(local_48->super_ToolOptions).passOptions.arguments,__k);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    return;
  }
  Fatal::Fatal((Fatal *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d8 + 0x10),"can\'t set ",10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1d8 + 0x10),(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  Fatal::operator<<((Fatal *)local_1d8,(char (*) [19])": pass not enabled");
LAB_001acb59:
  Fatal::~Fatal((Fatal *)local_1d8);
}

Assistant:

void addPassArg(const std::string& key, const std::string& value) override {
    // Scan the current pass list for the last defined instance of a pass named
    // like the argument under consideration.
    for (auto i = passes.rbegin(); i != passes.rend(); i++) {
      if (i->name != key) {
        continue;
      }

      if (i->argument.has_value()) {
        Fatal() << i->name << " already set to " << *(i->argument);
      }

      // Found? Store the argument value there and return.
      i->argument = value;
      return;
    }

    // Not found? Store it globally if there is no pass with the same name.
    if (!PassRegistry::get()->containsPass(key)) {
      return ToolOptions::addPassArg(key, value);
    }

    // Not found, but we have a pass with the same name? Bail out.
    Fatal() << "can't set " << key << ": pass not enabled";
  }